

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuVfsShmUnmap(sqlite3_file *pFile,int delFlag)

{
  int local_2c;
  int local_24;
  int eStage;
  int rc;
  rbu_file *p;
  int delFlag_local;
  sqlite3_file *pFile_local;
  
  local_24 = 0;
  if (pFile[3].pMethods == (sqlite3_io_methods *)0x0) {
    local_2c = 0;
  }
  else {
    local_2c = (pFile[3].pMethods)->iVersion;
  }
  if ((local_2c != 1) && (local_2c != 2)) {
    rbuUnlockShm((rbu_file *)pFile);
    local_24 = (**(code **)(*(long *)pFile[1].pMethods + 0x80))(pFile[1].pMethods,delFlag);
  }
  return local_24;
}

Assistant:

static int rbuVfsShmUnmap(sqlite3_file *pFile, int delFlag){
  rbu_file *p = (rbu_file*)pFile;
  int rc = SQLITE_OK;
  int eStage = (p->pRbu ? p->pRbu->eStage : 0);

  assert( p->openFlags & (SQLITE_OPEN_MAIN_DB|SQLITE_OPEN_TEMP_DB) );
  if( eStage==RBU_STAGE_OAL || eStage==RBU_STAGE_MOVE ){
    /* no-op */
  }else{
    /* Release the checkpointer and writer locks */
    rbuUnlockShm(p);
    rc = p->pReal->pMethods->xShmUnmap(p->pReal, delFlag);
  }
  return rc;
}